

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O2

void cf_socket_update_data(Curl_cfilter *cf,Curl_easy *data)

{
  long lVar1;
  undefined4 *puVar2;
  ip_quadruple *piVar3;
  
  if (((cf->field_0x24 & 1) != 0) && (cf->sockindex == 0)) {
    puVar2 = (undefined4 *)((long)cf->ctx + 0x9c);
    piVar3 = &(data->info).primary;
    for (lVar1 = 0x19; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(undefined4 *)piVar3->remote_ip = *puVar2;
      puVar2 = puVar2 + 1;
      piVar3 = (ip_quadruple *)(piVar3->remote_ip + 4);
    }
    (data->info).conn_remote_port = cf->conn->remote_port;
    return;
  }
  return;
}

Assistant:

static void cf_socket_update_data(struct Curl_cfilter *cf,
                                  struct Curl_easy *data)
{
  /* Update the IP info held in the transfer, if we have that. */
  if(cf->connected && (cf->sockindex == FIRSTSOCKET)) {
    struct cf_socket_ctx *ctx = cf->ctx;
    data->info.primary = ctx->ip;
    /* not sure if this is redundant... */
    data->info.conn_remote_port = cf->conn->remote_port;
  }
}